

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::AttrHelper_Color3ToAttrList
          (X3DExporter *this,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pList,string *pName,aiColor3D *pValue,aiColor3D *pDefaultValue)

{
  size_t *psVar1;
  pointer pcVar2;
  _Node *p_Var3;
  string tstr;
  string local_80;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  char local_30 [16];
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  if ((pValue->r == pDefaultValue->r) && (!NAN(pValue->r) && !NAN(pDefaultValue->r))) {
    if ((pValue->g == pDefaultValue->g) && (!NAN(pValue->g) && !NAN(pDefaultValue->g))) {
      if ((pValue->b == pDefaultValue->b) && (!NAN(pValue->b) && !NAN(pDefaultValue->b))) {
        return;
      }
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  AttrHelper_Col3DArrToString(this,pValue,1,&local_80);
  pcVar2 = (pName->_M_dataplus)._M_p;
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + pName->_M_string_length);
  local_40._M_p = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  p_Var3 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>(pList,(SAttribute *)local_60);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(pList->
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Color3ToAttrList(std::list<SAttribute>& pList, const std::string& pName, const aiColor3D& pValue, const aiColor3D& pDefaultValue)
{
string tstr;

	if(pValue == pDefaultValue) return;

	AttrHelper_Col3DArrToString(&pValue, 1, tstr);
	pList.push_back({pName, tstr});
}